

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alg.cpp
# Opt level: O2

double __thiscall
Alg::opimb_approx(Alg *this,Graph *graph,double budget,
                 vector<double,_std::allocator<double>_> *budget_list,double epsilon,double delta,
                 int mode)

{
  uint uVar1;
  TResult *pTVar2;
  ResultInfo *this_00;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  bool bVar7;
  bool bVar8;
  HyperGraph *this_01;
  int iVar9;
  ulong uVar10;
  ostream *poVar11;
  Graph *graph_00;
  byte bVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  double dVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double local_180;
  double local_138;
  double timeb;
  double local_e8;
  double dStack_e0;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double local_c0;
  Alg *local_b8;
  HyperGraph *local_b0;
  double local_a8;
  HyperGraph *local_a0;
  long local_98;
  vector<double,_std::allocator<double>_> *local_90;
  double local_88;
  Timer local_80;
  _Vector_base<double,_std::allocator<double>_> local_60;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  local_80.__StartTime.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_80.__processName = "OPIM-B-APPROX";
  dVar3 = 6.0 / delta;
  local_80.__LastTime.__d.__r = local_80.__StartTime.__d.__r;
  local_80.__EndTime.__d.__r = local_80.__StartTime.__d.__r;
  dVar4 = log(dVar3);
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_48,budget_list);
  iVar9 = cal_k_max((vector<double,_std::allocator<double>_> *)&local_48,budget);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_60,budget_list);
  cal_k_min((vector<double,_std::allocator<double>_> *)&local_60,budget);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_60);
  dVar16 = (double)this->__numV;
  dVar15 = (double)iVar9;
  dVar20 = log(dVar16);
  dVar5 = log(dVar3);
  dVar20 = (dVar20 * dVar15 + dVar5) * epsilon;
  if (dVar20 < 0.0) {
    dVar20 = sqrt(dVar20);
  }
  else {
    dVar20 = SQRT(dVar20);
  }
  dVar20 = dVar20 + dVar4 * epsilon;
  dVar16 = ((dVar16 + dVar16) * dVar20 * dVar20) / (double)this->__numV;
  uVar10 = (ulong)dVar16;
  dVar4 = log((double)this->__numV);
  dVar3 = log(dVar3);
  dVar3 = (dVar4 * dVar15 + dVar3) * epsilon;
  local_90 = budget_list;
  if (dVar3 < 0.0) {
    sqrt(dVar3);
  }
  bVar12 = 0;
  dVar3 = log2(epsilon * epsilon * dVar15);
  local_98 = ((long)(dVar3 - 9.223372036854776e+18) & (long)dVar3 >> 0x3f | (long)dVar3) + 1;
  auVar17._8_4_ = (int)((ulong)local_98 >> 0x20);
  auVar17._0_8_ = local_98;
  auVar17._12_4_ = 0x45300000;
  dVar3 = (((auVar17._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)local_98) - 4503599627370496.0)) * 3.0) / delta;
  dVar4 = log(dVar3);
  dVar3 = log(dVar3);
  timeb = 0.0;
  local_a0 = &this->__hyperG;
  local_b0 = &this->__hyperGVldt;
  local_a8 = (dVar4 + dVar4) / 9.0;
  dVar20 = dVar4 * 0.5;
  dVar3 = dVar3 * 0.5;
  local_c0 = SQRT(dVar20);
  local_c8 = SQRT(dVar3);
  local_138 = 0.0;
  local_180 = 0.0;
  local_b8 = this;
  bVar7 = false;
  while( true ) {
    poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::endl<char,std::char_traits<char>>(poVar11);
    graph_00 = (Graph *)(((long)(dVar16 - 9.223372036854776e+18) & (long)uVar10 >> 0x3f | uVar10) <<
                        (bVar12 & 0x3f));
    Timer::get_operation_time(&local_80);
    HyperGraph::build_n_RRsets(local_a0,(size_t)graph_00);
    this_01 = local_b0;
    HyperGraph::build_n_RRsets(local_b0,(size_t)graph_00);
    poVar11 = std::operator<<((ostream *)&std::cout,"# RR sets: ");
    poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
    std::endl<char,std::char_traits<char>>(poVar11);
    this->__numRRsets = (this->__hyperG).__numRRsets;
    dVar5 = Timer::get_operation_time(&local_80);
    dVar15 = max_cover_lazy_budget(this,graph_00,budget,local_90,&timeb,mode);
    local_88 = Timer::get_operation_time(&local_80);
    dVar6 = HyperGraph::self_inf_cal(this_01,&this->__vecSeed);
    auVar18._0_8_ = (double)CONCAT44(0x43300000,(int)this->__numRRsets);
    auVar18._8_4_ = (int)(this->__numRRsets >> 0x20);
    auVar18._12_4_ = 0x45300000;
    dStack_d0 = auVar18._8_8_ - 1.9342813113834067e+25;
    dVar21 = dVar15 / epsilon;
    dVar22 = dVar21;
    if (mode == 2) {
      if (this->__is_inf_cost == true) {
        if (this->__boundMin_inf_cost <= dVar21) {
          dVar22 = this->__boundMin_inf_cost;
        }
      }
      else {
        dVar22 = this->__boundMin_inf;
      }
    }
    else if (mode == 1) {
      dVar22 = this->__boundLast_inf;
      if (this->__boundLast_inf <= this->__boundLast_inf_cost) {
        dVar22 = this->__boundLast_inf_cost;
      }
    }
    local_d8 = ((dStack_d0 + (auVar18._0_8_ - 4503599627370496.0)) * dVar6) / (double)this->__numV +
               local_a8;
    std::operator<<((ostream *)&std::cout,"========upper bound ratio: ");
    poVar11 = std::ostream::_M_insert<double>(dVar22 / dVar21);
    poVar11 = std::operator<<(poVar11,"========");
    std::endl<char,std::char_traits<char>>(poVar11);
    auVar19._0_8_ = (double)CONCAT44(0x43300000,(int)this->__numRRsets);
    auVar19._8_4_ = (int)(this->__numRRsets >> 0x20);
    auVar19._12_4_ = 0x45300000;
    local_e8 = auVar19._0_8_ - 4503599627370496.0;
    dStack_e0 = auVar19._8_8_ - 1.9342813113834067e+25;
    uVar1 = this->__numV;
    if (local_d8 < 0.0) {
      dVar21 = sqrt(local_d8);
    }
    else {
      dVar21 = SQRT(local_d8);
    }
    dVar23 = local_c0;
    if (dVar20 < 0.0) {
      dVar23 = sqrt(dVar20);
    }
    dVar24 = ((dStack_e0 + local_e8) * dVar22) / (double)uVar1 + dVar3;
    local_d8 = dVar23;
    if (dVar24 < 0.0) {
      dVar24 = sqrt(dVar24);
    }
    else {
      dVar24 = SQRT(dVar24);
    }
    uVar13 = SUB84(local_c8,0);
    uVar14 = (undefined4)((ulong)local_c8 >> 0x20);
    if (dVar3 < 0.0) {
      local_e8 = dVar24;
      dVar23 = sqrt(dVar3);
      uVar13 = SUB84(dVar23,0);
      uVar14 = (undefined4)((ulong)dVar23 >> 0x20);
      dVar24 = local_e8;
    }
    dVar24 = dVar24 + (double)CONCAT44(uVar14,uVar13);
    local_180 = local_180 + dVar5;
    local_138 = local_138 + local_88;
    dVar5 = (dVar21 - local_d8) * (dVar21 - local_d8) - dVar4 / 18.0;
    dVar21 = 0.0;
    if (0.0 <= dVar5) {
      dVar21 = dVar5;
    }
    dVar21 = dVar21 / (dVar24 * dVar24);
    poVar11 = std::operator<<((ostream *)&std::cout," -->OPIM-B-APPROX (");
    bVar12 = bVar12 + 1;
    poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
    poVar11 = std::operator<<(poVar11,"/");
    poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
    std::operator<<(poVar11,") approx. (max-cover): ");
    poVar11 = std::ostream::_M_insert<double>(dVar21);
    std::operator<<(poVar11," (");
    poVar11 = std::ostream::_M_insert<double>(dVar15 / dVar22);
    poVar11 = std::operator<<(poVar11,"), #RR sets: ");
    poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
    std::operator<<(poVar11,'\n');
    if ((epsilon <= dVar21) && (bVar7)) break;
    bVar8 = bVar7;
    if (!bVar7) {
      bVar8 = true;
    }
    if (epsilon <= dVar21) {
      bVar7 = bVar8;
    }
  }
  pTVar2 = this->__tRes;
  pTVar2->__Approx = dVar21;
  dVar3 = Timer::get_total_time(&local_80);
  pTVar2->__RunningTime = dVar3;
  this_00 = this->__tRes;
  this_00->__Influence = dVar6;
  this_00->__InfluenceOriginal = dVar15;
  ResultInfo::set_seed_vec(this_00,&this->__vecSeed);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (&this->__tRes->__VecSeed_inf,&this->__vecSeed_inf);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (&this->__tRes->__VecSeed_inf_cost,&this->__vecSeed_inf_cost);
  pTVar2 = this->__tRes;
  pTVar2->__BoundMin_inf = this->__boundMin_inf;
  pTVar2->__BoundMin_inf_cost = this->__boundMin_inf_cost;
  pTVar2->__RRsetsSize = this->__numRRsets * 2;
  std::operator<<((ostream *)&std::cout,"==>Influence via R2: ");
  poVar11 = std::ostream::_M_insert<double>(dVar6);
  std::operator<<(poVar11,", time: ");
  poVar11 = std::ostream::_M_insert<double>(this->__tRes->__RunningTime);
  std::operator<<(poVar11,'\n');
  std::operator<<((ostream *)&std::cout,"==>Time for RR sets and greedy: ");
  poVar11 = std::ostream::_M_insert<double>(local_180);
  std::operator<<(poVar11,", ");
  dVar3 = timeb;
  poVar11 = std::ostream::_M_insert<double>(local_138 - timeb);
  std::operator<<(poVar11,'\n');
  std::operator<<((ostream *)&std::cout,"==>Time for Bound Computation: ");
  poVar11 = std::ostream::_M_insert<double>(dVar3);
  std::operator<<(poVar11,'\n');
  return 0.0;
}

Assistant:

double Alg::opimb_approx(const Graph & graph, const double budget, const std::vector<double> & budget_list,
        const double epsilon, const double delta, const int mode) {
    Timer timerOPIMC("OPIM-B-APPROX");
    const double approx = epsilon;
    const double alpha = sqrt(log(6.0 / delta));
    const int k_max = cal_k_max(budget_list, budget);
    const int k_min = cal_k_min(budget_list, budget);
    const auto theta_zero = (size_t) ((2.0 * __numV * pow2(approx * alpha
            + sqrt(approx * (k_max * log(__numV) + log(6.0 / delta))))) / (__numV));
    const auto theta_max = (size_t) ((2.0 * __numV * pow2(approx * alpha
            + sqrt(approx * (k_max * log(__numV) + log(6.0 / delta))))) / (pow2(epsilon) * k_max));
    const auto numIter = (size_t) log2(theta_max / theta_zero) + 1;
    const double a1 = log(numIter * 3.0 / delta);
    const double a2 = log(numIter * 3.0 / delta);
    double time1 = 0.0, time2 = 0.0;
    double timeb = 0.0;
    int satisfy_count = 0;
    size_t idx = 0;
    while (true) {
        std::cout << idx << std::endl;
        const auto numR = theta_zero << idx;
        timerOPIMC.get_operation_time();
        __hyperG.build_n_RRsets(numR); // R1
        __hyperGVldt.build_n_RRsets(numR); // R2
        std::cout << "# RR sets: " << numR << std::endl;
        __numRRsets = __hyperG.get_RR_sets_size();
        time1 += timerOPIMC.get_operation_time();
        const auto infSelf = max_cover_budget(graph, budget, budget_list, timeb, mode);
        time2 += timerOPIMC.get_operation_time();
        const auto infVldt = __hyperGVldt.self_inf_cal(__vecSeed);
        const auto degVldt = infVldt * __numRRsets / __numV;
        auto upperBound = infSelf / approx;
        auto upperBound_med = infSelf / approx;
        if (mode == 1) {
            upperBound = max_element(__boundLast_inf, __boundLast_inf_cost);
        }
        else if (mode == 2) {
            if (__is_inf_cost) {
                upperBound = __boundMin_inf_cost;
                upperBound = min_bound(upperBound, upperBound_med);
            }
            else {
                upperBound = __boundMin_inf;
            }
        }
        std::cout << "========upper bound ratio: " << upperBound / upperBound_med << "========" << std::endl;
        const auto upperDegOPT = upperBound * __numRRsets / __numV;
        auto lowerSelect = pow2(sqrt(degVldt + a1 * 2.0 / 9.0) - sqrt(a1 / 2.0)) - a1 / 18.0;
        if (lowerSelect < 0) {
            lowerSelect = 0;
        }
        const auto upperOPT = pow2(sqrt(upperDegOPT + a2 / 2.0) + sqrt(a2 / 2.0));
        const auto approxOPIMC = lowerSelect / upperOPT;
        std::cout << " -->OPIM-B-APPROX (" << idx + 1 << "/" << numIter << ") approx. (max-cover): " << approxOPIMC <<
                  " (" << infSelf / upperBound << "), #RR sets: " << __numRRsets << '\n';
        // Check whether the requirement is satisfied
        if (approxOPIMC >= approx && satisfy_count == 1)
        {
            __tRes.set_approximation(approxOPIMC);
            __tRes.set_running_time(timerOPIMC.get_total_time());
            __tRes.set_influence(infVldt);
            __tRes.set_influence_original(infSelf);
            __tRes.set_seed_vec(__vecSeed);
            __tRes.set_seed_inf_vec(__vecSeed_inf);
            __tRes.set_seed_inf_cost_vec(__vecSeed_inf_cost);
            __tRes.set_boundmin_inf(__boundMin_inf);
            __tRes.set_boundmin_inf_cost(__boundMin_inf_cost);
            __tRes.set_RR_sets_size(__numRRsets * 2);
            std::cout << "==>Influence via R2: " << infVldt << ", time: " << __tRes.get_running_time() << '\n';
            std::cout << "==>Time for RR sets and greedy: " << time1 << ", " << time2 - timeb << '\n';
            std::cout << "==>Time for Bound Computation: " << timeb << '\n';
            return 0;
        }
        else if (approxOPIMC >= approx && satisfy_count == 0) {
            satisfy_count = satisfy_count + 1;
        }
        idx = idx + 1;
    }
}